

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

bool Validator::nurseWorkingHalfWeekEnd(NurseSolution *nurse)

{
  int iVar1;
  vector<Turn_*,_std::allocator<Turn_*>_> *__x;
  size_type sVar2;
  reference ppTVar3;
  undefined1 local_30 [8];
  vector<Turn_*,_std::allocator<Turn_*>_> turns;
  NurseSolution *nurse_local;
  
  turns.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)nurse;
  __x = NurseSolution::getTurns(nurse);
  std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
            ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30,__x);
  sVar2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size
                    ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30);
  if (1 < sVar2) {
    sVar2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size
                      ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30);
    ppTVar3 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                        ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30,sVar2 - 1);
    iVar1 = Turn::getDay(*ppTVar3);
    if (iVar1 == 6) {
      sVar2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size
                        ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30);
      ppTVar3 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                          ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30,sVar2 - 2);
      iVar1 = Turn::getDay(*ppTVar3);
      if (iVar1 != 5) {
        nurse_local._7_1_ = true;
        goto LAB_001331f8;
      }
    }
    sVar2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size
                      ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30);
    ppTVar3 = std::vector<Turn_*,_std::allocator<Turn_*>_>::operator[]
                        ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30,sVar2 - 1);
    iVar1 = Turn::getDay(*ppTVar3);
    if (iVar1 == 5) {
      nurse_local._7_1_ = true;
      goto LAB_001331f8;
    }
  }
  nurse_local._7_1_ = false;
LAB_001331f8:
  std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
            ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_30);
  return nurse_local._7_1_;
}

Assistant:

bool Validator::nurseWorkingHalfWeekEnd(NurseSolution *nurse){

    vector<Turn *> turns = nurse->getTurns();

    if(turns.size() > 1)
    {
        if(turns[turns.size() - 1]->getDay() == 6)
            if(turns[turns.size() - 2]->getDay() != 5)
                return true;
        if(turns[turns.size() - 1]->getDay() == 5)
            return true;
    }

    return false;
}